

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O0

void __thiscall
randomx::AssemblyGeneratorX86::h_IMULH_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  ostream *poVar1;
  int in_EDX;
  Instruction *in_RSI;
  AssemblyGeneratorX86 *in_RDI;
  
  in_RDI->registerUsage[in_RSI->dst] = in_EDX;
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tmov rax, ");
  poVar1 = std::operator<<(poVar1,*(char **)(regR + (ulong)in_RSI->dst * 8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tmul ");
  poVar1 = std::operator<<(poVar1,*(char **)(regR + (ulong)in_RSI->src * 8));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&in_RDI->field_0x10,"\tmov ");
  poVar1 = std::operator<<(poVar1,*(char **)(regR + (ulong)in_RSI->dst * 8));
  poVar1 = std::operator<<(poVar1,", rdx");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  traceint(in_RDI,in_RSI);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IMULH_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		asmCode << "\tmov rax, " << regR[instr.dst] << std::endl;
		asmCode << "\tmul " << regR[instr.src] << std::endl;
		asmCode << "\tmov " << regR[instr.dst] << ", rdx" << std::endl;
		traceint(instr);
	}